

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxVariant.cpp
# Opt level: O0

void __thiscall Jinx::Variant::Read(Variant *this,BinaryReader *reader)

{
  ValueType VVar1;
  uint8_t local_1a;
  uint8_t local_19;
  uint8_t vt;
  BinaryReader *pBStack_18;
  uint8_t t;
  BinaryReader *reader_local;
  Variant *this_local;
  
  pBStack_18 = reader;
  reader_local = (BinaryReader *)this;
  Destroy(this);
  Impl::BinaryReader::Read(pBStack_18,&local_19);
  VVar1 = Impl::ByteToValueType(local_19);
  this->m_type = VVar1;
  switch(this->m_type) {
  case Null:
    break;
  case Number:
    Impl::BinaryReader::Read(pBStack_18,&(this->field_1).m_number);
    break;
  case Integer:
    Impl::BinaryReader::Read(pBStack_18,&(this->field_1).m_integer);
    break;
  case Boolean:
    Impl::BinaryReader::Read(pBStack_18,&(this->field_1).m_boolean);
    break;
  case String:
    std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::basic_string
              (&(this->field_1).m_string);
    Impl::BinaryReader::Read(pBStack_18,&(this->field_1).m_string);
    break;
  case Collection:
    break;
  case CollectionItr:
    break;
  case Function:
    Impl::BinaryReader::Read(pBStack_18,(uint64_t *)&(this->field_1).m_valType);
    break;
  case Coroutine:
    break;
  case UserObject:
    break;
  case Buffer:
    std::shared_ptr<Jinx::Buffer>::shared_ptr((shared_ptr<Jinx::Buffer> *)&(this->field_1).m_string)
    ;
    Impl::BinaryReader::Read(pBStack_18,&(this->field_1).m_buffer);
    break;
  case Guid:
    Impl::BinaryReader::Read(pBStack_18,&this->field_1,0x10);
    break;
  case ValType:
    Impl::BinaryReader::Read(pBStack_18,&local_1a);
    VVar1 = Impl::ByteToValueType(local_1a);
    (this->field_1).m_valType = VVar1;
    break;
  default:
    __assert_fail("!\"Unknown variant type!\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/JamesBoer[P]Jinx/Source/JxVariant.cpp"
                  ,0x330,"void Jinx::Variant::Read(Impl::BinaryReader &)");
  }
  return;
}

Assistant:

inline_t void Variant::Read(Impl::BinaryReader & reader)
	{
		Destroy();
		uint8_t t;
		reader.Read(&t);
		m_type = Impl::ByteToValueType(t);

		switch (m_type)
		{
			case ValueType::Null:
				break;
			case ValueType::Number:
				reader.Read(&m_number);
				break;
			case ValueType::Integer:
				reader.Read(&m_integer);
				break;
			case ValueType::Boolean:
				reader.Read(&m_boolean);
				break;
			case ValueType::String:
				new(&m_string) String();
				reader.Read(&m_string);
				break;
			case ValueType::Collection:
				break;
			case ValueType::CollectionItr:
				break;
			case ValueType::Function:
				reader.Read(&m_function);
				break;
			case ValueType::Coroutine:
				break;
			case ValueType::UserObject:
				break;
			case ValueType::Buffer:
				new(&m_buffer) BufferPtr();
				reader.Read(m_buffer);
				break;
			case ValueType::Guid:
				reader.Read(&m_guid, sizeof(m_guid));
				break;
			case ValueType::ValType:
			{
				uint8_t vt;
				reader.Read(&vt);
				m_valType = Impl::ByteToValueType(vt);
				break;
			}
			default:
				assert(!"Unknown variant type!");
		};

	}